

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinEsop.c
# Opt level: O1

int Min_EsopAddCubeInt(Min_Man_t *p,Min_Cube_t *pCube)

{
  Min_Cube_t **ppMVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Min_Cube_t *pMVar7;
  uint uVar8;
  Min_Cube_t *pMVar9;
  ulong uVar10;
  Min_Cube_t *pMVar11;
  Min_Cube_t *pMVar12;
  Min_Cube_t *pMVar13;
  Min_Cube_t *pEntry;
  
  uVar6 = *(uint *)&pCube->field_0x8;
  pMVar11 = (Min_Cube_t *)(p->ppStore + (uVar6 >> 0x16));
  pMVar12 = pMVar11->pNext;
  if (pMVar12 != (Min_Cube_t *)0x0) {
    uVar5 = uVar6 >> 10 & 0xfff;
    pMVar7 = pMVar11;
    pMVar9 = pMVar12;
    do {
      pMVar13 = pMVar11;
      pEntry = pMVar12;
      if (uVar5 == 0) {
LAB_00450d30:
        pMVar13->pNext = pEntry->pNext;
        Extra_MmFixedEntryRecycle(p->pMemMan,(char *)pCube);
        Extra_MmFixedEntryRecycle(p->pMemMan,(char *)pEntry);
        iVar3 = 0;
        goto LAB_00450e80;
      }
      uVar10 = 0;
      while (pCube->uData[uVar10] == pMVar9->uData[uVar10]) {
        uVar10 = uVar10 + 1;
        pMVar13 = pMVar7;
        pEntry = pMVar9;
        if (uVar5 == uVar10) goto LAB_00450d30;
      }
      ppMVar1 = &pMVar9->pNext;
      pMVar7 = pMVar9;
      pMVar9 = *ppMVar1;
    } while (*ppMVar1 != (Min_Cube_t *)0x0);
  }
  if ((uVar6 >> 0x16 < (uVar6 & 0x3ff)) &&
     (*(Min_Cube_t **)&pMVar11->field_0x8 != (Min_Cube_t *)0x0)) {
    pMVar12 = *(Min_Cube_t **)&pMVar11->field_0x8;
    pMVar11 = (Min_Cube_t *)&pMVar11->field_0x8;
LAB_00450b1a:
    pMVar7 = pMVar12;
    if ((*(ushort *)&pCube->field_0x9 & 0x3ffc) != 0) {
      pMVar12 = p->pTemp;
      uVar10 = 0;
      bVar2 = false;
      do {
        if (pCube->uData[uVar10] == pMVar7->uData[uVar10]) {
          uVar6 = 0;
          if (pMVar12 != (Min_Cube_t *)0x0) {
LAB_00450b72:
            pMVar12->uData[uVar10] = uVar6;
          }
        }
        else {
          if ((bVar2) ||
             (uVar6 = pMVar7->uData[uVar10] ^ pCube->uData[uVar10],
             uVar6 = (uVar6 >> 1 | uVar6) & 0x55555555, (uVar6 & uVar6 - 1) != 0))
          goto LAB_00450b97;
          if (pMVar12 != (Min_Cube_t *)0x0) {
            uVar6 = uVar6 * 3;
            bVar2 = true;
            goto LAB_00450b72;
          }
          bVar2 = true;
        }
        uVar10 = uVar10 + 1;
        if ((*(uint *)&pCube->field_0x8 >> 10 & 0xfff) <= uVar10) {
          if (bVar2) goto LAB_00450e1c;
          break;
        }
      } while( true );
    }
    putchar(10);
    Min_CubeWrite(_stdout,pCube);
    Min_CubeWrite(_stdout,pMVar7);
    puts("Error: Min_CubesDistOne() looks at two equal cubes!");
LAB_00450e1c:
    pMVar11->pNext = pMVar7->pNext;
    uVar6 = *(uint *)&pCube->field_0x8;
    uVar5 = uVar6 >> 10 & 0xfff;
    if (uVar5 != 0) {
      pMVar11 = p->pTemp;
      uVar10 = 0;
      do {
        uVar8 = pMVar7->uData[uVar10] ^ pCube->uData[uVar10];
        pCube->uData[uVar10] = uVar8;
        pCube->uData[uVar10] = ~pMVar11->uData[uVar10] & pMVar7->uData[uVar10] | uVar8;
        uVar10 = uVar10 + 1;
      } while (uVar5 != uVar10);
    }
    iVar3 = uVar6 + 0x400000;
    goto LAB_00450e6b;
  }
LAB_00450ba6:
  uVar6 = *(uint *)&pCube->field_0x8 >> 0x16;
  pMVar11 = p->ppStore[uVar6];
  if (pMVar11 != (Min_Cube_t *)0x0) {
    pMVar12 = (Min_Cube_t *)(p->ppStore + uVar6);
LAB_00450bc2:
    pMVar7 = pMVar11;
    if ((*(ushort *)&pCube->field_0x9 & 0x3ffc) != 0) {
      pMVar11 = p->pTemp;
      uVar10 = 0;
      bVar2 = false;
      do {
        if (pCube->uData[uVar10] == pMVar7->uData[uVar10]) {
          uVar6 = 0;
          if (pMVar11 != (Min_Cube_t *)0x0) {
LAB_00450c1a:
            pMVar11->uData[uVar10] = uVar6;
          }
        }
        else {
          if ((bVar2) ||
             (uVar6 = pMVar7->uData[uVar10] ^ pCube->uData[uVar10],
             uVar6 = (uVar6 >> 1 | uVar6) & 0x55555555, (uVar6 & uVar6 - 1) != 0))
          goto LAB_00450c3f;
          if (pMVar11 != (Min_Cube_t *)0x0) {
            uVar6 = uVar6 * 3;
            bVar2 = true;
            goto LAB_00450c1a;
          }
          bVar2 = true;
        }
        uVar10 = uVar10 + 1;
        if ((*(uint *)&pCube->field_0x8 >> 10 & 0xfff) <= uVar10) {
          if (bVar2) goto LAB_00450d8f;
          break;
        }
      } while( true );
    }
    putchar(10);
    Min_CubeWrite(_stdout,pCube);
    Min_CubeWrite(_stdout,pMVar7);
    puts("Error: Min_CubesDistOne() looks at two equal cubes!");
LAB_00450d8f:
    pMVar12->pNext = pMVar7->pNext;
    uVar6 = *(uint *)&pCube->field_0x8;
    uVar5 = uVar6 >> 10 & 0xfff;
    if (uVar5 != 0) {
      pMVar11 = p->pTemp;
      uVar10 = 0;
      do {
        uVar8 = pMVar7->uData[uVar10] ^ pCube->uData[uVar10];
        pCube->uData[uVar10] = uVar8;
        pCube->uData[uVar10] = ~pMVar11->uData[uVar10] & pMVar7->uData[uVar10] | uVar8;
        uVar10 = uVar10 + 1;
      } while (uVar5 != uVar10);
    }
    iVar3 = uVar6 - 0x400000;
LAB_00450e6b:
    *(int *)&pCube->field_0x8 = iVar3;
    goto LAB_00450e6f;
  }
LAB_00450c4e:
  if (0x3fffff < *(uint *)&pCube->field_0x8) {
    uVar10 = (ulong)(*(uint *)&pCube->field_0x8 >> 0x16);
    pMVar11 = p->ppStore[uVar10 - 1];
    if (pMVar11 != (Min_Cube_t *)0x0) {
      pMVar12 = (Min_Cube_t *)(p->ppStore + (uVar10 - 1));
LAB_00450c7c:
      pMVar7 = pMVar11;
      if ((*(ushort *)&pCube->field_0x9 & 0x3ffc) != 0) {
        pMVar11 = p->pTemp;
        uVar10 = 0;
        bVar2 = false;
        do {
          if (pCube->uData[uVar10] == pMVar7->uData[uVar10]) {
            uVar6 = 0;
            if (pMVar11 != (Min_Cube_t *)0x0) {
LAB_00450cd4:
              pMVar11->uData[uVar10] = uVar6;
            }
          }
          else {
            if ((bVar2) ||
               (uVar6 = pMVar7->uData[uVar10] ^ pCube->uData[uVar10],
               uVar6 = (uVar6 >> 1 | uVar6) & 0x55555555, (uVar6 & uVar6 - 1) != 0))
            goto LAB_00450cf9;
            if (pMVar11 != (Min_Cube_t *)0x0) {
              uVar6 = uVar6 * 3;
              bVar2 = true;
              goto LAB_00450cd4;
            }
            bVar2 = true;
          }
          uVar10 = uVar10 + 1;
          if ((*(uint *)&pCube->field_0x8 >> 10 & 0xfff) <= uVar10) {
            if (bVar2) goto LAB_00450ecb;
            break;
          }
        } while( true );
      }
      putchar(10);
      Min_CubeWrite(_stdout,pCube);
      Min_CubeWrite(_stdout,pMVar7);
      puts("Error: Min_CubesDistOne() looks at two equal cubes!");
LAB_00450ecb:
      pMVar12->pNext = pMVar7->pNext;
      uVar6 = *(uint *)&pCube->field_0x8 >> 10 & 0xfff;
      if (uVar6 != 0) {
        pMVar11 = p->pTemp;
        uVar10 = 0;
        do {
          uVar5 = pMVar7->uData[uVar10] ^ pCube->uData[uVar10];
          pCube->uData[uVar10] = uVar5;
          pCube->uData[uVar10] = ~pMVar11->uData[uVar10] & pMVar7->uData[uVar10] | uVar5;
          uVar10 = uVar10 + 1;
        } while (uVar6 != uVar10);
      }
LAB_00450e6f:
      Extra_MmFixedEntryRecycle(p->pMemMan,(char *)pMVar7);
      iVar3 = 1;
LAB_00450e80:
      iVar4 = -1;
      goto LAB_00450e85;
    }
  }
LAB_00450d08:
  ppMVar1 = p->ppStore;
  uVar6 = *(uint *)&pCube->field_0x8 >> 0x16;
  pCube->pNext = ppMVar1[uVar6];
  ppMVar1[uVar6] = pCube;
  iVar3 = 0;
  iVar4 = 1;
LAB_00450e85:
  p->nCubes = p->nCubes + iVar4;
  return iVar3;
LAB_00450b97:
  pMVar12 = pMVar7->pNext;
  pMVar11 = pMVar7;
  if (pMVar7->pNext == (Min_Cube_t *)0x0) goto LAB_00450ba6;
  goto LAB_00450b1a;
LAB_00450c3f:
  pMVar11 = pMVar7->pNext;
  pMVar12 = pMVar7;
  if (pMVar7->pNext == (Min_Cube_t *)0x0) goto LAB_00450c4e;
  goto LAB_00450bc2;
LAB_00450cf9:
  pMVar11 = pMVar7->pNext;
  pMVar12 = pMVar7;
  if (pMVar7->pNext == (Min_Cube_t *)0x0) goto LAB_00450d08;
  goto LAB_00450c7c;
}

Assistant:

int Min_EsopAddCubeInt( Min_Man_t * p, Min_Cube_t * pCube )
{
    Min_Cube_t * pThis, ** ppPrev;
    // try to find the identical cube
    Min_CoverForEachCubePrev( p->ppStore[pCube->nLits], pThis, ppPrev )
    {
        if ( Min_CubesAreEqual( pCube, pThis ) )
        {
            *ppPrev = pThis->pNext;
            Min_CubeRecycle( p, pCube );
            Min_CubeRecycle( p, pThis );
            p->nCubes--;
            return 0;
        }
    }
    // find a distance-1 cube if it exists
    if ( pCube->nLits < pCube->nVars )
    Min_CoverForEachCubePrev( p->ppStore[pCube->nLits+1], pThis, ppPrev )
    {
        if ( Min_CubesDistOne( pCube, pThis, p->pTemp ) )
        {
            *ppPrev = pThis->pNext;
            Min_CubesTransform( pCube, pThis, p->pTemp );
            pCube->nLits++;
            Min_CubeRecycle( p, pThis );
            p->nCubes--;
            return 1;
        }
    }
    Min_CoverForEachCubePrev( p->ppStore[pCube->nLits], pThis, ppPrev )
    {
        if ( Min_CubesDistOne( pCube, pThis, p->pTemp ) )
        {
            *ppPrev = pThis->pNext;
            Min_CubesTransform( pCube, pThis, p->pTemp );
            pCube->nLits--;
            Min_CubeRecycle( p, pThis );
            p->nCubes--;
            return 1;
        }
    }
    if ( pCube->nLits > 0 )
    Min_CoverForEachCubePrev( p->ppStore[pCube->nLits-1], pThis, ppPrev )
    {
        if ( Min_CubesDistOne( pCube, pThis, p->pTemp ) )
        {
            *ppPrev = pThis->pNext;
            Min_CubesTransform( pCube, pThis, p->pTemp );
            Min_CubeRecycle( p, pThis );
            p->nCubes--;
            return 1;
        }
    }
    // add the cube
    pCube->pNext = p->ppStore[pCube->nLits];
    p->ppStore[pCube->nLits] = pCube;
    p->nCubes++;
    return 0;
}